

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miam-core.c
# Opt level: O1

la_proto_node * la_miam_core_pdu_parse(char *txt)

{
  uint8_t *__s;
  byte bVar1;
  uint uVar2;
  size_t sVar3;
  char *end;
  byte *__ptr;
  byte *pbVar4;
  la_proto_node *plVar5;
  code *pcVar6;
  la_proto_node *plVar7;
  uint uVar8;
  char *__s_00;
  la_dict *list;
  byte bVar9;
  la_base85_decode_result lVar10;
  la_base85_decode_result lVar11;
  uint8_t *local_48;
  uint8_t *local_40;
  undefined8 local_38;
  
  sVar3 = strlen(txt);
  if (sVar3 < 3) {
    return (la_proto_node *)0x0;
  }
  bVar1 = *txt;
  if ((bVar1 & 0xfc) != 0x30 && 1 < (byte)(bVar1 - 0x2d)) {
    return (la_proto_node *)0x0;
  }
  bVar9 = txt[1];
  if ((bVar9 & 0xfc) != 0x30) {
    return (la_proto_node *)0x0;
  }
  __s_00 = txt + 2;
  end = strchr(__s_00,0x7c);
  if (end == __s_00 || end == (char *)0x0) {
    return (la_proto_node *)0x0;
  }
  lVar10 = la_base85_decode(__s_00,end);
  __ptr = lVar10.buf;
  if (__ptr == (byte *)0x0) {
    return (la_proto_node *)0x0;
  }
  uVar2 = (uint)(byte)(bVar9 - 0x30);
  if (lVar10.len < (int)uVar2) {
    return (la_proto_node *)0x0;
  }
  if (end[1] == '\0') {
LAB_0015560e:
    local_48 = (uint8_t *)0x0;
    lVar11 = (la_base85_decode_result)ZEXT816(0);
  }
  else {
    __s = (uint8_t *)(end + 1);
    if ((bVar1 & 0xfc) == 0x30) {
      sVar3 = strlen(end);
      lVar11 = la_base85_decode((char *)__s,end + sVar3);
      local_48 = lVar11.buf;
      if (local_48 != (uint8_t *)0x0) {
        uVar8 = 0;
        if ((int)(uint)(byte)(bVar1 - 0x30) <= lVar11.len) {
          uVar8 = (uint)(byte)(bVar1 - 0x30);
        }
        lVar11.len = lVar11.len - uVar8;
        lVar11.buf = local_48;
        lVar11._12_4_ = 0;
      }
    }
    else {
      if (bVar1 != 0x2d) goto LAB_0015560e;
      sVar3 = strlen((char *)__s);
      lVar11._8_8_ = sVar3;
      lVar11.buf = __s;
      local_48 = (uint8_t *)0x0;
    }
  }
  local_38 = lVar11._8_8_;
  local_40 = lVar11.buf;
  bVar1 = *__ptr;
  bVar9 = bVar1 & 0xf;
  pbVar4 = (byte *)la_xcalloc(1,0x60,
                              "/workspace/llm4binary/github/license_c_cmakelists/szpajder[P]libacars/libacars/miam-core.c"
                              ,0x100,"la_miam_core_pdu_parse");
  pbVar4[8] = 4;
  pbVar4[9] = 0;
  pbVar4[10] = 0;
  pbVar4[0xb] = 0;
  pbVar4[4] = bVar9;
  plVar5 = la_proto_node_new();
  plVar5->td = &la_DEF_miam_core_pdu;
  plVar5->data = pbVar4;
  plVar5->next = (la_proto_node *)0x0;
  if (bVar9 == 1) {
    list = la_miam_core_v1_pdu_parser_table;
  }
  else {
    if (bVar9 != 2) {
      *pbVar4 = *pbVar4 | 4;
      goto LAB_001556e1;
    }
    list = la_miam_core_v2_pdu_parser_table;
  }
  bVar1 = bVar1 >> 4;
  pcVar6 = (code *)la_dict_search(list,(uint)bVar1);
  if (pcVar6 == (code *)0x0) {
    *pbVar4 = *pbVar4 | 2;
  }
  else {
    *(uint *)(pbVar4 + 8) = (uint)bVar1;
    plVar7 = (la_proto_node *)(*pcVar6)(__ptr,lVar10.len - uVar2,local_40,local_38);
    plVar5->next = plVar7;
  }
LAB_001556e1:
  free(__ptr);
  free(local_48);
  return plVar5;
}

Assistant:

la_proto_node *la_miam_core_pdu_parse(char const *txt) {
	la_assert(txt != NULL);

	// Determine if it's a MIAM CORE PDU - check body/header padding counts and look for header/body delimiter
	if(strlen(txt) < 3) {
		return NULL;
	}
	la_miam_core_pdu *pdu = NULL;

	char bpad = txt[0];     // valid values: 0, 1, 2, 3, -, .
	char hpad = txt[1];     // valid values: 0, 1, 2, 3
	txt += 2;
	if(!((bpad >= '0' && bpad <= '3') || bpad == '-' || bpad == '.')) {
		la_debug_print(D_INFO, "Invalid body padding: %c\n", bpad);
		return NULL;
	}
	if(!(hpad >= '0' && hpad <= '3')) {
		la_debug_print(D_INFO, "Invalid header padding: %c\n", hpad);
		return NULL;
	}
	hpad -= 0x30;           // get digit value: '1' -> 1
	char *delim = strchr(txt, '|');
	if(delim == NULL) {
		la_debug_print(D_ERROR, "Header/body delimiter not found\n");
		return NULL;
	}
	if(delim == txt) {
		la_debug_print(D_ERROR, "Empty header\n");
		return NULL;
	}
	// Assume the initial part is the Header - try to decode it
	la_base85_decode_result header = la_base85_decode(txt, delim);
	if(header.buf == NULL || header.len < hpad) { // BASE85 decoder failed or result too short
		return NULL;
	}
	la_debug_print_buf_hex(D_VERBOSE, header.buf, header.len, "Decoded header:\n");

	// Decode message body, if exists and if it's encoded
	uint8_t *bodybuf = NULL;
	int bodylen = 0;
	la_base85_decode_result body = { .buf = NULL, .len = 0 };
	if(delim[1] != '\0') {
		if(bpad >= '0' && bpad <= '3') {
			char *end = strchr(delim, '\0');
			body = la_base85_decode(delim + 1, end);
			bpad -= 0x30;               // get digit value: '1' -> 1
			if(body.buf != NULL && body.len >= bpad) {
				body.len -= bpad;       // cut off padding bytes
			}
			bodybuf = body.buf;
			bodylen = body.len;
		} else if(bpad == '-') {
			// Payload not encoded - just point at the start of it
			bodybuf = (uint8_t *)delim + 1;
			bodylen = strlen(delim + 1);
		}
	}

	// From now on we assume that this is a MIAM frame and we return a non-NULL PDU with an
	// error code if something goes wrong, so that a proper error message is printed to the output.
	uint8_t *b = header.buf;
	header.len -= hpad;                 // cut off padding bytes

	uint8_t version = b[0] & 0xf;
	uint8_t pdu_type = (b[0] >> 4) & 0xf;
	la_debug_print(D_INFO, "ver: %u pdu_type: %u\n", version, pdu_type);

	pdu = LA_XCALLOC(1, sizeof(la_miam_core_pdu));
	pdu->pdu_type = LA_MIAM_CORE_PDU_UNKNOWN;
	pdu->version = version;

	la_proto_node *node = la_proto_node_new();
	node->td = &la_DEF_miam_core_pdu;
	node->data = pdu;
	node->next = NULL;

	la_dict const *pdu_parse_dict = NULL;
	if(version == 1) {
		pdu_parse_dict = la_miam_core_v1_pdu_parser_table;
	} else if(version == 2) {
		pdu_parse_dict = la_miam_core_v2_pdu_parser_table;
	} else {
		la_debug_print(D_ERROR, "Unknown version %u\n", version);
		pdu->err |= LA_MIAM_ERR_HDR_PDU_VERSION_UNKNOWN;
		goto end;
	}

	la_miam_core_pdu_parse_f *pdu_parse = la_dict_search(pdu_parse_dict, pdu_type);
	if(pdu_parse == NULL) {
		la_debug_print(D_ERROR, "No parser for PDU type %u\n", pdu_type);
		pdu->err |= LA_MIAM_ERR_HDR_PDU_TYPE_UNKNOWN;
		goto end;
	}

	pdu->pdu_type = pdu_type;
	node->next = pdu_parse(header.buf, header.len, bodybuf, bodylen);

end:
	LA_XFREE(header.buf);
	LA_XFREE(body.buf);
	return node;
}